

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

EmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitReplaceLaneExpr
          (WasmBytecodeGenerator *this,OpCodeAsmJs op,WasmType *signature)

{
  WasmType type;
  code *pcVar1;
  bool bVar2;
  EmitInfo EVar3;
  EmitInfo EVar4;
  undefined4 *puVar5;
  EmitInfo EVar6;
  WasmRegisterSpace *this_00;
  EmitInfo EVar7;
  EmitInfo local_50;
  EmitInfo valueArg;
  EmitInfo indexInfo;
  
  type = *signature;
  EVar3 = PopEvalStack(this,signature[1],L"lane argument type mismatch");
  local_50 = EVar3;
  EVar4 = PopEvalStack(this,V128,L"simd argument type mismatch");
  if (type != V128) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x5fa,"(resultType == WasmTypes::V128)","resultType == WasmTypes::V128");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  EVar6 = EmitLaneIndex(this,op);
  valueArg = EVar6;
  this_00 = GetRegisterSpace(this,type);
  EVar7.super_EmitInfoBase.location = WAsmJs::RegisterSpace::AcquireTmpRegister(this_00);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x11])
            (this->m_writer,(ulong)op,(ulong)EVar7.super_EmitInfoBase.location,EVar4,
             (ulong)EVar6 & 0xffffffff,EVar3);
  ReleaseLocation(this,&valueArg);
  ReleaseLocation(this,&local_50);
  EVar7.type = type;
  return EVar7;
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitReplaceLaneExpr(Js::OpCodeAsmJs op, const WasmTypes::WasmType* signature) {

    const WasmTypes::WasmType resultType = signature[0];
    const WasmTypes::WasmType valueType = signature[1];
    EmitInfo valueArg = PopEvalStack(valueType, _u("lane argument type mismatch"));

    EmitInfo simdArg = PopEvalStack(WasmTypes::V128, _u("simd argument type mismatch"));
    Assert(resultType == WasmTypes::V128);

    EmitInfo indexInfo = EmitLaneIndex(op);
    Js::RegSlot resultReg = GetRegisterSpace(resultType)->AcquireTmpRegister();
    EmitInfo result(resultReg, resultType);

    m_writer->AsmReg4(op, resultReg, simdArg.location, indexInfo.location, valueArg.location);
    ReleaseLocation(&indexInfo);
    ReleaseLocation(&valueArg);
    return result;
}